

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void BenchmarkFunc<TAvx2Exp<false>,double>
               (vector<double_*,_std::allocator<double_*>_> *inVectors,
               vector<double_*,_std::allocator<double_*>_> *outVectors,size_t vecSize,size_t nIter,
               string *name)

{
  double dVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  runtime_error *this;
  size_t sVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> times;
  double local_38;
  
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar8 = 0;
  do {
    if (sVar8 == nIter) {
      std::
      __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
      std::operator<<(poVar7,": ");
      poVar7 = std::ostream::_M_insert<double>
                         (*times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&times.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    for (uVar9 = 0;
        ppdVar2 = (inVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(inVectors->super__Vector_base<double_*,_std::allocator<double_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppdVar2 >> 3);
        uVar9 = uVar9 + 1) {
      ppdVar3 = (outVectors->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      NFastOps::ExpAvx2<false,false>(ppdVar2[uVar9],vecSize,ppdVar3[uVar9]);
      pdVar4 = ppdVar3[uVar9];
      if (pdVar4 != (double *)0x0) {
        dVar1 = *pdVar4;
        if ((dVar1 == 43432432.0) && (!NAN(dVar1))) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"requirement outV[0] != 43432432 failed");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    local_38 = (double)(lVar6 - lVar5) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&times,&local_38);
    sVar8 = sVar8 + 1;
  } while( true );
}

Assistant:

void BenchmarkFunc(const std::vector<T*>& inVectors, std::vector<T*>& outVectors,
                   size_t vecSize, size_t nIter, const std::string& name) {
    std::chrono::high_resolution_clock::time_point t;
    std::vector<double> times;
    for (size_t iterIdx = 0; iterIdx < nIter; ++iterIdx) {
        t = std::chrono::high_resolution_clock::now();
        (void)(iterIdx);
        for (size_t vecIdx = 0; vecIdx < inVectors.size(); ++vecIdx) {
            auto& inV = inVectors[vecIdx];
            auto& outV = outVectors[vecIdx];
            TFunc::Apply(inV, vecSize, outV);
            if (outV && outV[0] == 43432432) {
                throw std::runtime_error("requirement outV[0] != 43432432 failed");
            }
        }
        std::chrono::duration<double> timeSpan = std::chrono::high_resolution_clock::now() - t;
        times.push_back(timeSpan.count());
    }
    std::sort(times.begin(), times.end());
    std::cerr << name << ": " << times[0] << std::endl;
}